

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O2

void __thiscall
afsm::
state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
::defer_event<afsm::test::events::a_to_b>
          (state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
           *this,a_to_b *event)

{
  id_type *local_30;
  undefined1 *local_28;
  state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  *local_20;
  
  detail::observer_wrapper<afsm::test::test_fsm_observer>::
  defer_event<afsm::state_machine<afsm::test::outer_machine,afsm::none,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::events::a_to_b>
            (&this->super_observer_wrapper<afsm::test::test_fsm_observer>,this,event);
  local_30 = (id_type *)&detail::event<afsm::test::events::a_to_b>::id;
  local_20 = this;
  std::__cxx11::
  list<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
  ::
  emplace_back<afsm::state_machine<afsm::test::outer_machine,afsm::none,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::defer_event<afsm::test::events::a_to_b>(afsm::test::events::a_to_b&&)::_lambda()_1_,afsm::detail::event_base::id_type_const*>
            ((list<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
              *)&this->deferred_events_,(anon_class_16_2_20c42392 *)&local_28,&local_30);
  local_28 = &detail::event<afsm::test::events::a_to_b>::id;
  std::
  _Rb_tree<afsm::detail::event_base::id_type_const*,afsm::detail::event_base::id_type_const*,std::_Identity<afsm::detail::event_base::id_type_const*>,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
  ::_M_insert_unique<afsm::detail::event_base::id_type_const*>
            ((_Rb_tree<afsm::detail::event_base::id_type_const*,afsm::detail::event_base::id_type_const*,std::_Identity<afsm::detail::event_base::id_type_const*>,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
              *)&this->deferred_event_ids_,(id_type **)&local_28);
  return;
}

Assistant:

void
    defer_event(Event&& event)
    {
        using evt_identity = typename detail::event_identity<Event>::type;

        observer_wrapper::defer_event(*this, ::std::forward<Event>(event));
        Event evt{::std::forward<Event>(event)};
        deferred_events_.emplace_back([&, evt]() mutable {
            return process_event_dispatch(::std::move(evt));
        }, &evt_identity::id);
        deferred_event_ids_.insert(&evt_identity::id);
    }